

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_trange.c
# Opt level: O0

ErrorNumber test_func_trange(TA_History *history)

{
  ErrorNumber EVar1;
  char *pcVar2;
  uint *in_RDI;
  ErrorNumber retValue;
  uint i;
  TA_Test_conflict16 *in_stack_00000030;
  TA_History *in_stack_00000038;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if (0x10 < local_14) {
      return TA_TEST_PASS;
    }
    if ((int)*in_RDI < tableTest[local_14].expectedNbElement) break;
    EVar1 = do_test(in_stack_00000038,in_stack_00000030);
    if (EVar1 != TA_TEST_PASS) {
      pcVar2 = "TA_TRANGE";
      if (tableTest[local_14].doAverage != 0) {
        pcVar2 = "TA_ATR";
      }
      printf("%s Failed Test #%d (Code=%d)\n",pcVar2,(ulong)local_14,(ulong)EVar1);
      return EVar1;
    }
    local_14 = local_14 + 1;
  }
  pcVar2 = "TA_TRANGE";
  if (tableTest[local_14].doAverage != 0) {
    pcVar2 = "TA_ATR";
  }
  printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",pcVar2,(ulong)local_14,
         (ulong)(uint)tableTest[local_14].expectedNbElement,(ulong)*in_RDI);
  return TA_TESTUTIL_TFRR_BAD_PARAM;
}

Assistant:

ErrorNumber test_func_trange( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n",
                 tableTest[i].doAverage? "TA_ATR":"TA_TRANGE",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n",
                 tableTest[i].doAverage? "TA_ATR":"TA_TRANGE",
                 i, retValue );
         return retValue;
      }
   }


   /* All test succeed. */
   return TA_TEST_PASS;
}